

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3WalClose(Wal *pWal,sqlite3 *db,int sync_flags,int nBuf,u8 *zBuf)

{
  sqlite3_io_methods *psVar1;
  sqlite3_file *psVar2;
  _func_int_sqlite3_vfs_ptr_char_ptr_int *p_Var3;
  int iVar4;
  int isDelete;
  int bPersist;
  int local_34;
  
  if (pWal == (Wal *)0x0) {
    return 0;
  }
  isDelete = 0;
  if (zBuf == (u8 *)0x0) {
LAB_0013925e:
    iVar4 = 0;
  }
  else {
    iVar4 = (*pWal->pDbFd->pMethods->xLock)(pWal->pDbFd,4);
    if (iVar4 == 0) {
      if (pWal->exclusiveMode == '\0') {
        pWal->exclusiveMode = '\x01';
      }
      iVar4 = sqlite3WalCheckpoint
                        (pWal,db,0,(_func_int_void_ptr *)0x0,(void *)0x0,sync_flags,nBuf,zBuf,
                         (int *)0x0,(int *)0x0);
      if (iVar4 == 0) {
        local_34 = -1;
        psVar1 = pWal->pDbFd->pMethods;
        isDelete = 1;
        if ((psVar1 != (sqlite3_io_methods *)0x0) &&
           ((*psVar1->xFileControl)(pWal->pDbFd,10,&local_34), local_34 == 1)) {
          if (pWal->mxWalSize < 0) {
            isDelete = 0;
          }
          else {
            isDelete = 0;
            walLimitSize(pWal,0);
          }
        }
        goto LAB_0013925e;
      }
    }
    isDelete = 0;
  }
  walIndexClose(pWal,isDelete);
  psVar2 = pWal->pWalFd;
  if (psVar2->pMethods != (sqlite3_io_methods *)0x0) {
    (*psVar2->pMethods->xClose)(psVar2);
    psVar2->pMethods = (sqlite3_io_methods *)0x0;
  }
  if (isDelete != 0) {
    if (sqlite3Hooks_0 != (code *)0x0) {
      (*sqlite3Hooks_0)();
    }
    p_Var3 = pWal->pVfs->xDelete;
    if (p_Var3 != (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
      (*p_Var3)(pWal->pVfs,pWal->zWalName,0);
    }
    if (sqlite3Hooks_1 != (code *)0x0) {
      (*sqlite3Hooks_1)();
    }
  }
  sqlite3_free(pWal->apWiData);
  sqlite3_free(pWal);
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalClose(
  Wal *pWal,                      /* Wal to close */
  sqlite3 *db,                    /* For interrupt flag */
  int sync_flags,                 /* Flags to pass to OsSync() (or 0) */
  int nBuf,
  u8 *zBuf                        /* Buffer of at least nBuf bytes */
){
  int rc = SQLITE_OK;
  if( pWal ){
    int isDelete = 0;             /* True to unlink wal and wal-index files */

    assert( walAssertLockmask(pWal) );

    /* If an EXCLUSIVE lock can be obtained on the database file (using the
    ** ordinary, rollback-mode locking methods, this guarantees that the
    ** connection associated with this log file is the only connection to
    ** the database. In this case checkpoint the database and unlink both
    ** the wal and wal-index files.
    **
    ** The EXCLUSIVE lock is not released before returning.
    */
    if( zBuf!=0
     && SQLITE_OK==(rc = sqlite3OsLock(pWal->pDbFd, SQLITE_LOCK_EXCLUSIVE))
    ){
      if( pWal->exclusiveMode==WAL_NORMAL_MODE ){
        pWal->exclusiveMode = WAL_EXCLUSIVE_MODE;
      }
      rc = sqlite3WalCheckpoint(pWal, db,
          SQLITE_CHECKPOINT_PASSIVE, 0, 0, sync_flags, nBuf, zBuf, 0, 0
      );
      if( rc==SQLITE_OK ){
        int bPersist = -1;
        sqlite3OsFileControlHint(
            pWal->pDbFd, SQLITE_FCNTL_PERSIST_WAL, &bPersist
        );
        if( bPersist!=1 ){
          /* Try to delete the WAL file if the checkpoint completed and
          ** fsynced (rc==SQLITE_OK) and if we are not in persistent-wal
          ** mode (!bPersist) */
          isDelete = 1;
        }else if( pWal->mxWalSize>=0 ){
          /* Try to truncate the WAL file to zero bytes if the checkpoint
          ** completed and fsynced (rc==SQLITE_OK) and we are in persistent
          ** WAL mode (bPersist) and if the PRAGMA journal_size_limit is a
          ** non-negative value (pWal->mxWalSize>=0).  Note that we truncate
          ** to zero bytes as truncating to the journal_size_limit might
          ** leave a corrupt WAL file on disk. */
          walLimitSize(pWal, 0);
        }
      }
    }

    walIndexClose(pWal, isDelete);
    sqlite3OsClose(pWal->pWalFd);
    if( isDelete ){
      sqlite3BeginBenignMalloc();
      sqlite3OsDelete(pWal->pVfs, pWal->zWalName, 0);
      sqlite3EndBenignMalloc();
    }
    WALTRACE(("WAL%p: closed\n", pWal));
    sqlite3_free((void *)pWal->apWiData);
    sqlite3_free(pWal);
  }
  return rc;
}